

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::handleUnderOverlay(QPDFJob *this,QPDF *pdf)

{
  element_type *peVar1;
  pointer pUVar2;
  _Head_base<0UL,_QPDF_*,_false> _Var3;
  Rectangle rect;
  long lVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  iterator __end1;
  pointer pUVar7;
  long lVar8;
  QPDFPageObjectHelper *dest_page;
  QPDFJob *this_00;
  UnderOverlay *underlay;
  ulong i;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_t sVar10;
  iterator __begin1;
  UnderOverlay *uo;
  undefined1 local_2d8 [32];
  string content;
  int pageno;
  string *local_280;
  string local_278;
  QPDFObjectHandle this_page_fo;
  QPDFObjectHandle dest_page_oh;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  code *pcStack_220;
  QPDFObjectHandle local_210;
  shared_ptr<Buffer> local_200;
  shared_ptr<Buffer> content_data;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> main_pages;
  vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
  opages;
  vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
  upages;
  QPDFObjectHandle resources;
  undefined1 local_178 [16];
  map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
  overlay_fo;
  map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
  underlay_fo;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  QPDFObjectHandle local_e0;
  QPDFPageDocumentHelper main_pdh;
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  overlay_pagenos;
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  underlay_pagenos;
  Rectangle local_50;
  
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pUVar7 = (peVar1->underlay).
           super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>._M_impl
           .super__Vector_impl_data._M_start;
  pUVar2 = *(pointer *)
            ((long)&(peVar1->underlay).
                    super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                    ._M_impl.super__Vector_impl_data + 8);
  this_00 = this;
  if ((pUVar7 != pUVar2) ||
     ((peVar1->overlay).
      super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>._M_impl.
      super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(peVar1->overlay).
               super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>.
               _M_impl.super__Vector_impl_data + 8))) {
    for (; pUVar7 != pUVar2; pUVar7 = pUVar7 + 1) {
      this_00 = this;
      validateUnderOverlay(this,pdf,pUVar7);
    }
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pUVar7 = *(pointer *)
              ((long)&(peVar1->overlay).
                      super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (uo = (peVar1->overlay).
              super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>.
              _M_impl.super__Vector_impl_data._M_start; uo != pUVar7; uo = uo + 1) {
      this_00 = this;
      validateUnderOverlay(this,pdf,uo);
    }
    underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header;
    underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header;
    overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    getUOPagenos(this_00,&((this->m).
                           super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->underlay,&underlay_pagenos);
    getUOPagenos(this_00,&((this->m).
                           super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->overlay,&overlay_pagenos);
    local_108._M_unused._M_object = (void *)0x0;
    local_108._8_8_ = 0;
    local_f0 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:1998:17)>
               ::_M_invoke;
    local_f8 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:1998:17)>
               ::_M_manager;
    doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_108);
    if (local_f8 != (code *)0x0) {
      (*local_f8)(&local_108,&local_108,__destroy_functor);
    }
    upages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    upages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    upages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pUVar7 = (peVar1->underlay).
             super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pUVar2 = *(pointer *)
              ((long)&(peVar1->underlay).
                      super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (pUVar7 != pUVar2) {
      do {
        _Var3._M_head_impl =
             *(QPDF **)&(pUVar7->pdf)._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>.
                        _M_t.super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>;
        if ((_Head_base<0UL,_QPDF_*,_false>)_Var3._M_head_impl !=
            (_Head_base<0UL,_QPDF_*,_false>)0x0) {
          QPDFPageDocumentHelper::QPDFPageDocumentHelper
                    ((QPDFPageDocumentHelper *)&underlay_fo,_Var3._M_head_impl);
          QPDFPageDocumentHelper::getAllPages
                    ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                     &overlay_fo,(QPDFPageDocumentHelper *)&underlay_fo);
          std::
          vector<std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>,std::allocator<std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>>>
          ::emplace_back<std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>>
                    ((vector<std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>,std::allocator<std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>>>
                      *)&upages,
                     (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                     &overlay_fo);
          std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
                    ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                     &overlay_fo);
          QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&underlay_fo);
        }
        pUVar7 = pUVar7 + 1;
      } while (pUVar7 != pUVar2);
    }
    opages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    opages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    opages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pUVar7 = (peVar1->overlay).
             super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pUVar2 = *(pointer *)
              ((long)&(peVar1->overlay).
                      super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (pUVar7 != pUVar2) {
      do {
        _Var3._M_head_impl =
             *(QPDF **)&(pUVar7->pdf)._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>.
                        _M_t.super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>;
        if ((_Head_base<0UL,_QPDF_*,_false>)_Var3._M_head_impl !=
            (_Head_base<0UL,_QPDF_*,_false>)0x0) {
          QPDFPageDocumentHelper::QPDFPageDocumentHelper
                    ((QPDFPageDocumentHelper *)&underlay_fo,_Var3._M_head_impl);
          QPDFPageDocumentHelper::getAllPages
                    ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                     &overlay_fo,(QPDFPageDocumentHelper *)&underlay_fo);
          std::
          vector<std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>,std::allocator<std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>>>
          ::emplace_back<std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>>
                    ((vector<std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>,std::allocator<std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>>>
                      *)&opages,
                     (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                     &overlay_fo);
          std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
                    ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                     &overlay_fo);
          QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&underlay_fo);
        }
        pUVar7 = pUVar7 + 1;
      } while (pUVar7 != pUVar2);
    }
    underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header;
    underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    underlay_fo._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header;
    overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    overlay_fo._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    QPDFPageDocumentHelper::QPDFPageDocumentHelper(&main_pdh,pdf);
    QPDFPageDocumentHelper::getAllPages(&main_pages,&main_pdh);
    if ((long)main_pages.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)main_pages.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar4 = ((long)main_pages.
                     super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)main_pages.
                     super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      i = 0;
      local_280 = (string *)pdf;
      do {
        paVar9 = &content.field_2;
        if (i >> 0x1f != 0) {
          QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
        }
        pageno = (int)i + 1;
        local_238._8_8_ = (element_type *)0x0;
        pcStack_220 = std::
                      _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2023:13)>
                      ::_M_invoke;
        local_228._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2023:13)>
             ::_M_manager;
        local_238._M_allocated_capacity =
             (size_type)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pageno;
        doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_238);
        if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          (*(code *)local_228._M_pi)(&local_238,&local_238,3);
        }
        pmVar5 = std::
                 map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                 ::operator[](&underlay_pagenos,(key_type *)&pageno);
        if (((pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) ||
           (pmVar5 = std::
                     map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                     ::operator[](&overlay_pagenos,(key_type *)&pageno),
           (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
          uVar6 = ((long)main_pages.
                         super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)main_pages.
                         super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
          if (uVar6 < i || uVar6 - i == 0) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",i
                      );
          }
          dest_page_oh.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               main_pages.
               super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
               _M_impl.super__Vector_impl_data._M_start[i].super_QPDFObjectHelper.super_BaseHandle.
               obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          dest_page_oh.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               main_pages.
               super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
               _M_impl.super__Vector_impl_data._M_start[i].super_QPDFObjectHelper.super_BaseHandle.
               obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (dest_page_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (dest_page_oh.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (dest_page_oh.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (dest_page_oh.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (dest_page_oh.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          dest_page = main_pages.
                      super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                      ._M_impl.super__Vector_impl_data._M_start + i;
          QPDFPageObjectHelper::getFormXObjectForPage
                    ((QPDFPageObjectHelper *)&this_page_fo,SUB81(dest_page,0));
          QPDFObjectHandle::getRawStreamData((QPDFObjectHandle *)&content_data);
          local_200.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_200.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          if (content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_M_use_count =
                   (content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_M_use_count =
                   (content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_M_use_count + 1;
            }
          }
          content._M_dataplus._M_p = (pointer)0x0;
          content._M_string_length = 0;
          local_2d8._0_8_ = (element_type *)0x0;
          local_2d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          QPDFObjectHandle::replaceStreamData
                    (&this_page_fo,&local_200,(QPDFObjectHandle *)&content,
                     (QPDFObjectHandle *)local_2d8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
          }
          if (content._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)content._M_string_length);
          }
          if (local_200.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_200.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          content._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::string::_M_construct<char_const*>((string *)&content,"/Resources","");
          operator____qpdf(local_2d8,0x26a363);
          QPDFObjectHandle::replaceKeyAndGetNew
                    (&resources,(string *)&dest_page_oh,(QPDFObjectHandle *)&content);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)content._M_dataplus._M_p != paVar9) {
            operator_delete(content._M_dataplus._M_p,
                            CONCAT71(content.field_2._M_allocated_capacity._1_7_,
                                     content.field_2._M_local_buf[0]) + 1);
          }
          content._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::string::_M_construct<char_const*>((string *)&content,"/XObject","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_278,(string *)&resources);
          local_2d8._0_8_ = local_2d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"/Fx0","");
          QPDFObjectHandle::replaceKeyAndGetNew(&local_e0,&local_278,(QPDFObjectHandle *)local_2d8);
          if (local_e0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e0.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
            operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)content._M_dataplus._M_p != paVar9) {
            operator_delete(content._M_dataplus._M_p,
                            CONCAT71(content.field_2._M_allocated_capacity._1_7_,
                                     content.field_2._M_local_buf[0]) + 1);
          }
          content._M_string_length = 0;
          content.field_2._M_local_buf[0] = '\0';
          peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          pUVar7 = (peVar1->underlay).
                   super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pUVar2 = *(pointer *)
                    ((long)&(peVar1->underlay).
                            super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                            ._M_impl.super__Vector_impl_data + 8);
          content._M_dataplus._M_p = (pointer)paVar9;
          if (pUVar7 != pUVar2) {
            lVar8 = 0;
            sVar10 = 0;
            do {
              doUnderOverlayForPage_abi_cxx11_
                        ((string *)local_2d8,this,(QPDF *)local_280,pUVar7,&underlay_pagenos,i,
                         sVar10,&underlay_fo,
                         (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                         ((long)&((upages.
                                   super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar8),dest_page);
              std::__cxx11::string::_M_append((char *)&content,local_2d8._0_8_);
              if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
                operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
              }
              sVar10 = sVar10 + 1;
              pUVar7 = pUVar7 + 1;
              lVar8 = lVar8 + 0x18;
            } while (pUVar7 != pUVar2);
          }
          local_210.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = this_page_fo.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_210.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               this_page_fo.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (this_page_fo.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_page_fo.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (this_page_fo.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_page_fo.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (this_page_fo.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"/Fx0","");
          QPDFPageObjectHelper::getMediaBox((QPDFPageObjectHelper *)local_178,SUB81(dest_page,0));
          QPDFObjectHandle::getArrayAsRectangle(&local_50,(QPDFObjectHandle *)local_178);
          rect.lly = local_50.lly;
          rect.llx = local_50.llx;
          rect.urx = local_50.urx;
          rect.ury = local_50.ury;
          QPDFPageObjectHelper::placeFormXObject
                    ((string *)local_2d8,dest_page,&local_210,&local_278,rect,true,false,false);
          std::__cxx11::string::_M_append((char *)&content,local_2d8._0_8_);
          if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
            operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if (local_210.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_210.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          pUVar7 = (peVar1->overlay).
                   super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pUVar2 = *(pointer *)
                    ((long)&(peVar1->overlay).
                            super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                            ._M_impl.super__Vector_impl_data + 8);
          if (pUVar7 != pUVar2) {
            lVar8 = 0;
            sVar10 = 0;
            do {
              doUnderOverlayForPage_abi_cxx11_
                        ((string *)local_2d8,this,(QPDF *)local_280,pUVar7,&overlay_pagenos,i,sVar10
                         ,&overlay_fo,
                         (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                         ((long)&((opages.
                                   super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar8),dest_page);
              std::__cxx11::string::_M_append((char *)&content,local_2d8._0_8_);
              if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
                operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
              }
              sVar10 = sVar10 + 1;
              pUVar7 = pUVar7 + 1;
              lVar8 = lVar8 + 0x18;
            } while (pUVar7 != pUVar2);
          }
          local_2d8._0_8_ = local_2d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"/Contents","");
          QPDF::newStream((QPDF *)&local_278,local_280);
          QPDFObjectHandle::replaceKey
                    (&dest_page_oh,(string *)local_2d8,(QPDFObjectHandle *)&local_278);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
          }
          if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
            operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)content._M_dataplus._M_p != &content.field_2) {
            operator_delete(content._M_dataplus._M_p,
                            CONCAT71(content.field_2._M_allocated_capacity._1_7_,
                                     content.field_2._M_local_buf[0]) + 1);
          }
          if (resources.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (resources.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (this_page_fo.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (this_page_fo.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (dest_page_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (dest_page_oh.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        i = i + 1;
      } while (i != lVar4 + (ulong)(lVar4 == 0));
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&main_pages);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&main_pdh);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
    ::~_Rb_tree(&overlay_fo._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
    ::~_Rb_tree(&underlay_fo._M_t);
    std::
    vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ::~vector(&opages);
    std::
    vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ::~vector(&upages);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
    ::~_Rb_tree(&overlay_pagenos._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
    ::~_Rb_tree(&underlay_pagenos._M_t);
  }
  return;
}

Assistant:

void
QPDFJob::handleUnderOverlay(QPDF& pdf)
{
    if (m->underlay.empty() && m->overlay.empty()) {
        return;
    }
    for (auto& uo: m->underlay) {
        validateUnderOverlay(pdf, &uo);
    }
    for (auto& uo: m->overlay) {
        validateUnderOverlay(pdf, &uo);
    }

    // First map key is 1-based page number. Second is index into the overlay/underlay vector. Watch
    // out to not reverse the keys or be off by one.
    std::map<int, std::map<size_t, std::vector<int>>> underlay_pagenos;
    std::map<int, std::map<size_t, std::vector<int>>> overlay_pagenos;
    getUOPagenos(m->underlay, underlay_pagenos);
    getUOPagenos(m->overlay, overlay_pagenos);
    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
        v << prefix << ": processing underlay/overlay\n";
    });

    auto get_pages = [](std::vector<UnderOverlay>& v,
                        std::vector<std::vector<QPDFPageObjectHelper>>& v_out) {
        for (auto const& uo: v) {
            if (uo.pdf) {
                v_out.push_back(QPDFPageDocumentHelper(*(uo.pdf)).getAllPages());
            }
        }
    };
    std::vector<std::vector<QPDFPageObjectHelper>> upages;
    get_pages(m->underlay, upages);
    std::vector<std::vector<QPDFPageObjectHelper>> opages;
    get_pages(m->overlay, opages);

    std::map<int, std::map<size_t, QPDFObjectHandle>> underlay_fo;
    std::map<int, std::map<size_t, QPDFObjectHandle>> overlay_fo;
    QPDFPageDocumentHelper main_pdh(pdf);
    auto main_pages = main_pdh.getAllPages();
    size_t main_npages = main_pages.size();
    for (size_t page_idx = 0; page_idx < main_npages; ++page_idx) {
        auto pageno = QIntC::to_int(page_idx) + 1;
        doIfVerbose(
            [&](Pipeline& v, std::string const& prefix) { v << "  page " << pageno << "\n"; });
        if (underlay_pagenos[pageno].empty() && overlay_pagenos[pageno].empty()) {
            continue;
        }
        // This code converts the original page, any underlays, and any overlays to form XObjects.
        // Then it concatenates display of all underlays, the original page, and all overlays. Prior
        // to 11.3.0, the original page contents were wrapped in q/Q, but this didn't work if the
        // original page had unbalanced q/Q operators. See GitHub issue #904.
        auto& dest_page = main_pages.at(page_idx);
        auto dest_page_oh = dest_page.getObjectHandle();
        auto this_page_fo = dest_page.getFormXObjectForPage();
        // The resulting form xobject lazily reads the content from the original page, which we are
        // going to replace. Therefore, we have to explicitly copy it.
        auto content_data = this_page_fo.getRawStreamData();
        this_page_fo.replaceStreamData(content_data, QPDFObjectHandle(), QPDFObjectHandle());
        auto resources =
            dest_page_oh.replaceKeyAndGetNew("/Resources", "<< /XObject << >> >>"_qpdf);
        resources.getKey("/XObject").replaceKeyAndGetNew("/Fx0", this_page_fo);
        size_t uo_idx{0};
        std::string content;
        for (auto& underlay: m->underlay) {
            content += doUnderOverlayForPage(
                pdf,
                underlay,
                underlay_pagenos,
                page_idx,
                uo_idx,
                underlay_fo,
                upages[uo_idx],
                dest_page);
            ++uo_idx;
        }
        content += dest_page.placeFormXObject(
            this_page_fo,
            "/Fx0",
            dest_page.getMediaBox().getArrayAsRectangle(),
            true,
            false,
            false);
        uo_idx = 0;
        for (auto& overlay: m->overlay) {
            content += doUnderOverlayForPage(
                pdf,
                overlay,
                overlay_pagenos,
                page_idx,
                uo_idx,
                overlay_fo,
                opages[uo_idx],
                dest_page);
            ++uo_idx;
        }
        dest_page_oh.replaceKey("/Contents", pdf.newStream(content));
    }
}